

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.h
# Opt level: O0

void __thiscall
GlobalBailOutRecordDataTable::
IterateGlobalBailOutRecordTableRows<BailOutRecord::DumpLocalOffsets(unsigned_int,int)::__0>
          (GlobalBailOutRecordDataTable *this,uint32 bailOutRecordId,
          anon_class_16_2_3f8e8a0c callback)

{
  uint local_28;
  uint i;
  uint32 bailOutRecordId_local;
  GlobalBailOutRecordDataTable *this_local;
  anon_class_16_2_3f8e8a0c callback_local;
  
  callback_local.name = (char16 *)callback.this;
  this_local = (GlobalBailOutRecordDataTable *)callback.name;
  local_28 = 0;
  do {
    if (this->length <= local_28) {
      return;
    }
    if (bailOutRecordId <= this->globalBailOutRecordDataRows[local_28].end) {
      if (bailOutRecordId < this->globalBailOutRecordDataRows[local_28].start) {
        return;
      }
      BailOutRecord::DumpLocalOffsets::anon_class_16_2_3f8e8a0c::operator()
                ((anon_class_16_2_3f8e8a0c *)&this_local,
                 this->globalBailOutRecordDataRows + local_28);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void IterateGlobalBailOutRecordTableRows(uint32 bailOutRecordId, Fn callback)
    {
        // Visit all the rows that have this bailout ID in their range.
        for (uint i = 0; i < this->length; i++)
        {
            if (bailOutRecordId > globalBailOutRecordDataRows[i].end)
            {
                // Not in range.
                continue;
            }

            if (globalBailOutRecordDataRows[i].start > bailOutRecordId)
            {
                // Not in range, and we know there are no more in range (since the table is sorted by "start").
                return;
            }

            // In range: take action.
            callback(&globalBailOutRecordDataRows[i]);
        }
    }